

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O1

void tokthini(errcxdef *errctx,mcmcxdef *memctx,toktdef *toktab1)

{
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var1;
  long lVar2;
  
  lVar2 = 0;
  memset(toktab1,0,0xb50);
  toktab1->toktfadd = tokthadd;
  toktab1->toktfsea = tokthsea;
  toktab1->toktfset = tokthset;
  toktab1->toktfeach = toktheach;
  toktab1->tokterr = errctx;
  toktab1[1].toktfadd = (_func_void_toktdef_ptr_char_ptr_int_int_int_int *)memctx;
  p_Var1 = (_func_void_toktdef_ptr_char_ptr_int_int_int_int *)
           mcmalo0(memctx,0x1000,(mcmon *)((long)&toktab1[0x2b].tokterr + 4),0xffff,0);
  toktab1[0x3c].toktfadd = p_Var1;
  *(undefined4 *)&toktab1[0x2b].tokterr = 0;
  *(undefined2 *)&toktab1[0x3c].toktfsea = 0x1000;
  do {
    *(undefined2 *)(&toktab1[1].toktfsea + lVar2) = 0xffff;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void tokthini(errcxdef *errctx, mcmcxdef *memctx, toktdef *toktab1)
{
    tokthdef *toktab = (tokthdef *)toktab1;      /* convert to correct type */
    int       i;

    CLRSTRUCT(*toktab);
    toktab->tokthsc.toktfadd = tokthadd;           /* set add-symbol method */
    toktab->tokthsc.toktfsea = tokthsea;         /* set search-table method */
    toktab->tokthsc.toktfset = tokthset;                   /* update symbol */
    toktab->tokthsc.toktfeach = toktheach;       /* call fn for all symbols */
    toktab->tokthsc.tokterr = errctx;         /* set error handling context */
    toktab->tokthmem = memctx;                    /* memory manager context */
    toktab->tokthcpool = mcmalo(memctx, (ushort)TOKTHSIZE,
                                &toktab->tokthpool[0]);
    toktab->tokthpcnt = 0;
    toktab->tokthsize = TOKTHSIZE;

    /* set hash table entries to point to nothing (MCMONINV) */
    for (i = 0 ; i < TOKHASHSIZE ; ++i)
        toktab->tokthhsh[i].tokthpobj = MCMONINV;
}